

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanOrder.c
# Opt level: O2

void Abc_NodeSortCubes(Abc_Obj_t *pNode,Vec_Ptr_t *vCubes,Vec_Str_t *vStore,int fWeight)

{
  size_t __n;
  char *__dest;
  void *__src;
  long lVar1;
  int i;
  code *Vec_PtrSortCompare;
  char *pcVar2;
  
  __dest = (char *)(pNode->field_5).pData;
  lVar1 = (long)(pNode->vFanins).nSize;
  vCubes->nSize = 0;
  __n = lVar1 + 3;
  pcVar2 = __dest;
  while( true ) {
    if (*pcVar2 == '\0') {
      Vec_PtrSortCompare = Abc_NodeCompareCubes2;
      if (fWeight == 0) {
        Vec_PtrSortCompare = Abc_NodeCompareCubes1;
      }
      Vec_PtrSort(vCubes,Vec_PtrSortCompare);
      Vec_StrGrow(vStore,vCubes->nSize * (int)__n);
      pcVar2 = vStore->pArray;
      i = 0;
      while( true ) {
        if (vCubes->nSize <= i) {
          memcpy(__dest,vStore->pArray,(long)(vCubes->nSize * (int)__n));
          return;
        }
        __src = Vec_PtrEntry(vCubes,i);
        if (*(char *)((long)__src + lVar1) != '\0') break;
        *(undefined1 *)((long)__src + lVar1) = 0x20;
        memcpy(pcVar2,__src,__n);
        pcVar2 = pcVar2 + __n;
        i = i + 1;
      }
      __assert_fail("pCube[nVars] == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcFanOrder.c"
                    ,0x1e6,"void Abc_NodeSortCubes(Abc_Obj_t *, Vec_Ptr_t *, Vec_Str_t *, int)");
    }
    if (pcVar2[lVar1] != ' ') break;
    pcVar2[lVar1] = '\0';
    Vec_PtrPush(vCubes,pcVar2);
    pcVar2 = pcVar2 + __n;
  }
  __assert_fail("pCube[nVars] == \' \'",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcFanOrder.c"
                ,0x1da,"void Abc_NodeSortCubes(Abc_Obj_t *, Vec_Ptr_t *, Vec_Str_t *, int)");
}

Assistant:

void Abc_NodeSortCubes( Abc_Obj_t * pNode, Vec_Ptr_t * vCubes, Vec_Str_t * vStore, int fWeight )
{
    char * pCube, * pPivot;
    char * pSop = (char *)pNode->pData;
    int i, nVars = Abc_ObjFaninNum(pNode);
    Vec_PtrClear( vCubes );
    Abc_SopForEachCube( pSop, nVars, pCube )
    {
        assert( pCube[nVars] == ' ' );
        pCube[nVars] = 0;
        Vec_PtrPush( vCubes, pCube );
    }
    if ( fWeight )
        Vec_PtrSort( vCubes, (int (*)())Abc_NodeCompareCubes2 );
    else
        Vec_PtrSort( vCubes, (int (*)())Abc_NodeCompareCubes1 );
    Vec_StrGrow( vStore, Vec_PtrSize(vCubes) * (nVars + 3) );
    pPivot = Vec_StrArray( vStore );
    Vec_PtrForEachEntry( char *, vCubes, pCube, i )
    {
        assert( pCube[nVars] == 0 );
        pCube[nVars] = ' ';
        memcpy( pPivot, pCube, (size_t)(nVars + 3) );
        pPivot += nVars + 3;
    }
    memcpy( pSop, Vec_StrArray(vStore), (size_t)(Vec_PtrSize(vCubes) * (nVars + 3)) );
}